

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O3

void __thiscall SocketLog::post(SocketLog *this,string *msg)

{
  int iVar1;
  
  if (this->inited != true) {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->msgQueueMutex);
  if (iVar1 == 0) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->msgQueue).c,msg);
    pthread_mutex_unlock((pthread_mutex_t *)&this->msgQueueMutex);
    std::condition_variable::notify_one();
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void SocketLog::post(const std::string& msg) {
    if (!inited)
        return;

    msgQueueMutex.lock();
    msgQueue.push(msg);
    msgQueueMutex.unlock();
    msgQueueCondition.notify_one();
}